

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

InvalidStatement * __thiscall
slang::BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
          (BumpAllocator *this,Statement **args)

{
  Statement *pSVar1;
  InvalidStatement *pIVar2;
  
  pIVar2 = (InvalidStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InvalidStatement *)this->endPtr < pIVar2 + 1) {
    pIVar2 = (InvalidStatement *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pIVar2 + 1);
  }
  pSVar1 = *args;
  (pIVar2->super_Statement).kind = Invalid;
  (pIVar2->super_Statement).syntax = (StatementSyntax *)0x0;
  (pIVar2->super_Statement).sourceRange.startLoc = (SourceLocation)0x0;
  (pIVar2->super_Statement).sourceRange.endLoc = (SourceLocation)0x0;
  pIVar2->child = pSVar1;
  return pIVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }